

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

void __thiscall slang::ast::DiagnosticVisitor::finalize(DiagnosticVisitor *this)

{
  char_pointer puVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  Compilation *pCVar4;
  size_t sVar5;
  pointer pEVar6;
  Symbol *this_00;
  InstanceSymbol *instance;
  size_type sVar7;
  GenericClassDefSymbol *this_01;
  pointer ppAVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  StackAllocator<const_slang::ast::Type_*,_64UL,_16UL> SVar12;
  bool bVar13;
  ulong pos0;
  Type *pTVar14;
  char_pointer puVar15;
  pointer ppGVar16;
  value_type *elements;
  uint uVar18;
  char_pointer puVar19;
  not_null<const_slang::ast::Symbol_*> *sym;
  long lVar20;
  ulong hash;
  ulong uVar21;
  ulong uVar22;
  pointer ppIVar23;
  value_type_pointer ppTVar24;
  long lVar25;
  pointer ppIVar26;
  uchar uVar27;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  iterator iVar33;
  SmallSet<const_slang::ast::Type_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>_>
  visitedSpecs;
  _Iterator<false> __begin4;
  SmallVector<const_slang::ast::Type_*,_5UL> toVisit;
  locator res;
  Type *local_158;
  pointer local_150;
  pointer local_148;
  ulong local_140;
  undefined1 local_138 [16];
  pointer local_128;
  Storage *local_f8;
  Storage *local_f0;
  undefined1 local_e8 [24];
  value_type_pointer ppTStack_d0;
  ulong local_c8;
  ulong local_c0;
  _Iterator<false> local_b0;
  StackAllocator<const_slang::ast::Type_*,_64UL,_16UL> local_98;
  long local_90;
  undefined8 local_88;
  undefined1 local_80 [40];
  locator local_58;
  _Parent local_40;
  table_element_pointer ppVar17;
  
  pCVar4 = this->compilation;
  if ((pCVar4->hierarchicalAssignments).
      super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pCVar4->hierarchicalAssignments).
      super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->disableCache = true;
    std::
    vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
    ::vector((vector<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
              *)local_138,&pCVar4->hierarchicalAssignments);
    uVar11 = local_138._8_8_;
    for (ppIVar26 = (pointer)local_138._0_8_; ppIVar26 != (pointer)uVar11; ppIVar26 = ppIVar26 + 1)
    {
      sVar5 = ((__extent_storage<18446744073709551615UL> *)
              &((*ppIVar26)->super_InstanceSymbolBase).super_Symbol.location)->_M_extent_value;
      if (sVar5 != 0) {
        pEVar6 = ((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)
                 &((*ppIVar26)->super_InstanceSymbolBase).super_Symbol.name._M_str)->_M_ptr;
        lVar20 = 0;
        do {
          this_00 = *(Symbol **)((long)&(pEVar6->symbol).ptr + lVar20);
          if ((this_00->kind == Instance) && (this_00[1].originatingSyntax != (SyntaxNode *)0x0)) {
            Symbol::visit<slang::ast::DiagnosticVisitor&>(this_00,this);
          }
          lVar20 = lVar20 + 0x20;
        } while (sVar5 << 5 != lVar20);
      }
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
    }
  }
  pCVar4 = this->compilation;
  if ((pCVar4->virtualInterfaceInstances).
      super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pCVar4->virtualInterfaceInstances).
      super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
      ::vector((vector<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                *)local_138,&pCVar4->virtualInterfaceInstances);
      uVar11 = local_138._8_8_;
      pCVar4 = this->compilation;
      ppIVar26 = (pCVar4->virtualInterfaceInstances).
                 super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar23 = (pointer)local_138._0_8_;
      if ((pCVar4->virtualInterfaceInstances).
          super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppIVar26) {
        (pCVar4->virtualInterfaceInstances).
        super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppIVar26;
      }
      for (; ppIVar23 != (pointer)uVar11; ppIVar23 = ppIVar23 + 1) {
        instance = *ppIVar23;
        Symbol::visit<slang::ast::DiagnosticVisitor&>((Symbol *)instance,this);
        Compilation::checkVirtualIfaceInstance(this->compilation,instance);
      }
      if ((pointer)local_138._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
      }
      pCVar4 = this->compilation;
    } while ((pCVar4->virtualInterfaceInstances).
             super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pCVar4->virtualInterfaceInstances).
             super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_f8 = (Storage *)local_138;
  local_e8._0_8_ = 0x3f;
  local_e8._8_8_ = 1;
  stack0xffffffffffffff28 = ZEXT816(0x516460);
  local_c8 = 0;
  local_c0 = 0;
  local_98.storage = (Storage *)local_80;
  local_88 = 5;
  local_f0 = local_f8;
  do {
    sVar7 = (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.
            len;
    if (sVar7 == 0) {
      bVar13 = false;
    }
    else {
      ppGVar16 = (this->genericClasses).
                 super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_;
      local_150 = ppGVar16 + sVar7;
      bVar13 = false;
      do {
        local_90 = 0;
        local_40._M_base._M_r = &(*ppGVar16)->specMap;
        local_148 = ppGVar16;
        local_b0._M_current =
             boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
             ::begin(&(local_40._M_base._M_r)->table_);
        local_b0._M_parent = &local_40;
        while (SVar12.storage = local_98.storage,
              local_b0._M_current.p_ != (table_element_pointer)0x0) {
          pTVar14 = (local_b0._M_current.p_)->second;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = pTVar14;
          hash = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
          pos0 = hash >> (local_e8[0] & 0x3f);
          uVar3 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[hash & 0xff];
          local_140 = local_e8._8_8_;
          uVar22 = 0;
          uVar21 = pos0;
          do {
            pgVar2 = (group_type_pointer)(local_e8._16_8_ + uVar21 * 0x10);
            uVar27 = (uchar)uVar3;
            auVar32[0] = -(pgVar2->m[0].n == uVar27);
            uVar29 = (uchar)((uint)uVar3 >> 8);
            auVar32[1] = -(pgVar2->m[1].n == uVar29);
            uVar30 = (uchar)((uint)uVar3 >> 0x10);
            auVar32[2] = -(pgVar2->m[2].n == uVar30);
            uVar31 = (uchar)((uint)uVar3 >> 0x18);
            auVar32[3] = -(pgVar2->m[3].n == uVar31);
            auVar32[4] = -(pgVar2->m[4].n == uVar27);
            auVar32[5] = -(pgVar2->m[5].n == uVar29);
            auVar32[6] = -(pgVar2->m[6].n == uVar30);
            auVar32[7] = -(pgVar2->m[7].n == uVar31);
            auVar32[8] = -(pgVar2->m[8].n == uVar27);
            auVar32[9] = -(pgVar2->m[9].n == uVar29);
            auVar32[10] = -(pgVar2->m[10].n == uVar30);
            auVar32[0xb] = -(pgVar2->m[0xb].n == uVar31);
            auVar32[0xc] = -(pgVar2->m[0xc].n == uVar27);
            auVar32[0xd] = -(pgVar2->m[0xd].n == uVar29);
            auVar32[0xe] = -(pgVar2->m[0xe].n == uVar30);
            auVar32[0xf] = -(pgVar2->m[0xf].n == uVar31);
            for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe); uVar18 != 0
                ; uVar18 = uVar18 - 1 & uVar18) {
              uVar9 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              if (pTVar14 == ppTStack_d0[uVar21 * 0xf + (ulong)uVar9]) {
                ppTVar24 = ppTStack_d0 + uVar21 * 0xf + (ulong)uVar9;
                goto LAB_0037479f;
              }
            }
            if ((((group_type_pointer)(local_e8._16_8_ + uVar21 * 0x10))->m[0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) {
              ppTVar24 = (value_type_pointer)0x0;
              goto LAB_0037479f;
            }
            lVar20 = uVar21 + uVar22;
            uVar22 = uVar22 + 1;
            uVar21 = lVar20 + 1U & local_e8._8_8_;
          } while (uVar22 <= (ulong)local_e8._8_8_);
          ppTVar24 = (value_type_pointer)0x0;
LAB_0037479f:
          local_158 = pTVar14;
          if (ppTVar24 == (value_type_pointer)0x0) {
            if (local_c0 < local_c8) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
              ::nosize_unchecked_emplace_at<slang::ast::Type_const*>
                        (&local_58,
                         (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                          *)&local_f0,(arrays_type *)local_e8,pos0,hash,&local_158);
              local_c0 = local_c0 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
              ::unchecked_emplace_with_rehash<slang::ast::Type_const*>
                        (&local_58,
                         (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,slang::detail::hashing::StackAllocator<slang::ast::Type_const*,64ul,16ul>>
                          *)&local_f0,hash,&local_158);
            }
            local_58.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pTVar14;
            SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                      ((SmallVectorBase<slang::ast::Type_const*> *)&local_98,(Type **)&local_58);
          }
          std::ranges::
          transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
          ::_Iterator<false>::operator++(&local_b0);
        }
        if (local_90 != 0) {
          lVar25 = local_90 << 3;
          lVar20 = 0;
          do {
            Symbol::visit<slang::ast::DiagnosticVisitor&>
                      (*(Symbol **)((SVar12.storage)->buffer + lVar20),this);
            lVar20 = lVar20 + 8;
          } while (lVar25 != lVar20);
          bVar13 = true;
        }
        ppGVar16 = local_148 + 1;
      } while (ppGVar16 != local_150);
    }
    local_90 = 0;
  } while (bVar13);
  sVar7 = (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.
          len;
  if (sVar7 != 0) {
    ppGVar16 = (this->genericClasses).
               super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.data_;
    lVar20 = 0;
    do {
      this_01 = *(GenericClassDefSymbol **)((long)ppGVar16 + lVar20);
      if ((this_01->specMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.size == 0) {
        pTVar14 = GenericClassDefSymbol::getInvalidSpecialization(this_01);
        Symbol::visit<slang::ast::DiagnosticVisitor&>(&pTVar14->super_Symbol,this);
      }
      lVar20 = lVar20 + 8;
    } while (sVar7 << 3 != lVar20);
  }
  iVar33 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
           ::begin(&(this->compilation->attributeMap).table_);
  ppVar17 = iVar33.p_;
joined_r0x003748f0:
  if (ppVar17 == (table_element_pointer)0x0) {
    if (local_98.storage != (Storage *)local_80) {
      operator_delete(local_98.storage);
    }
    local_98.storage = local_f0;
    if (ppTStack_d0 != (Type **)0x0) {
      slang::detail::hashing::StackAllocator<const_slang::ast::Type_*,_64UL,_16UL>::deallocate
                (&local_98,ppTStack_d0,local_e8._8_8_ * 0x88 + 0x96U >> 3);
    }
    return;
  }
  sVar5 = ((iVar33.p_)->second)._M_extent._M_extent_value;
  if (sVar5 != 0) {
    ppAVar8 = ((iVar33.p_)->second)._M_ptr;
    lVar20 = 0;
    do {
      AttributeSymbol::getValue(*(AttributeSymbol **)((long)ppAVar8 + lVar20));
      lVar20 = lVar20 + 8;
    } while (sVar5 << 3 != lVar20);
  }
  puVar15 = iVar33.pc_ + 2;
  do {
    puVar19 = puVar15;
    puVar15 = iVar33.pc_;
    ppVar17 = iVar33.p_ + 1;
    if (((uint)iVar33.pc_ & 0xf) == 0xe) goto LAB_0037495f;
    puVar1 = puVar19 + -1;
    iVar33.p_ = ppVar17;
    iVar33.pc_ = puVar15 + 1;
    puVar15 = puVar19 + 1;
  } while (*puVar1 == '\0');
  puVar19 = puVar19 + -1;
  if (*puVar1 == '\x01') {
    ppVar17 = (table_element_pointer)0x0;
  }
  goto LAB_00374953;
LAB_0037495f:
  do {
    auVar28[0] = -(*puVar19 == '\0');
    auVar28[1] = -(puVar19[1] == '\0');
    auVar28[2] = -(puVar19[2] == '\0');
    auVar28[3] = -(puVar19[3] == '\0');
    auVar28[4] = -(puVar19[4] == '\0');
    auVar28[5] = -(puVar19[5] == '\0');
    auVar28[6] = -(puVar19[6] == '\0');
    auVar28[7] = -(puVar19[7] == '\0');
    auVar28[8] = -(puVar19[8] == '\0');
    auVar28[9] = -(puVar19[9] == '\0');
    auVar28[10] = -(puVar19[10] == '\0');
    auVar28[0xb] = -(puVar19[0xb] == '\0');
    auVar28[0xc] = -(puVar19[0xc] == '\0');
    auVar28[0xd] = -(puVar19[0xd] == '\0');
    auVar28[0xe] = -(puVar19[0xe] == '\0');
    auVar28[0xf] = -(puVar19[0xf] == '\0');
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
    if (uVar18 == 0x7fff) {
      puVar19 = puVar19 + 0x10;
      ppVar17 = ppVar17 + 0xf;
    }
    else {
      uVar9 = 0;
      if ((uVar18 ^ 0x7fff) != 0) {
        for (; ((uVar18 ^ 0x7fff) >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      if (puVar19[uVar9] == '\x01') {
        ppVar17 = (table_element_pointer)0x0;
      }
      else {
        puVar19 = puVar19 + uVar9;
        ppVar17 = ppVar17 + uVar9;
      }
    }
  } while (uVar18 == 0x7fff);
LAB_00374953:
  iVar33.p_ = ppVar17;
  iVar33.pc_ = puVar19;
  goto joined_r0x003748f0;
}

Assistant:

void finalize() {
        // Once everything has been visited, go back over and check things that might
        // have been influenced by visiting later symbols.

        // For all hierarchical assignments, make sure we actually visited their
        // target instances and didn't skip them due to caching.
        if (!compilation.hierarchicalAssignments.empty()) {
            disableCache = true;
            auto hierarchicalAssignments = compilation.hierarchicalAssignments;
            for (auto hierRef : hierarchicalAssignments) {
                // Walk the path and visit all instances we find that were previously cached.
                for (auto& [sym, _] : hierRef->path) {
                    if (sym->kind == SymbolKind::Instance) {
                        auto& inst = sym->as<InstanceSymbol>();
                        if (inst.getCanonicalBody() != nullptr)
                            inst.visit(*this);
                    }
                }
            }
        }

        // Check the validity of virtual interface assignments.
        while (!compilation.virtualInterfaceInstances.empty()) {
            auto vii = compilation.virtualInterfaceInstances;
            compilation.virtualInterfaceInstances.clear();

            for (auto inst : vii) {
                inst->visit(*this);
                compilation.checkVirtualIfaceInstance(*inst);
            }
        }

        // Visiting a specialization can trigger more specializations to be made for the
        // same or other generic classes, so we need to be careful here when iterating.
        SmallSet<const Type*, 8> visitedSpecs;
        SmallVector<const Type*> toVisit;
        bool didSomething;
        do {
            didSomething = false;
            for (auto symbol : genericClasses) {
                for (auto& spec : symbol->specializations()) {
                    if (visitedSpecs.emplace(&spec).second)
                        toVisit.push_back(&spec);
                }

                for (auto spec : toVisit) {
                    spec->visit(*this);
                    didSomething = true;
                }

                toVisit.clear();
            }
        } while (didSomething);

        // Go back over and find generic classes that were never instantiated
        // and force an empty one to make sure we collect all diagnostics that
        // don't depend on parameter values.
        for (auto symbol : genericClasses) {
            if (symbol->numSpecializations() == 0)
                symbol->getInvalidSpecialization().visit(*this);
        }

        // Visit all attributes and force their values to resolve.
        for (auto& [_, attrList] : compilation.attributeMap) {
            for (auto attr : attrList)
                attr->getValue();
        }
    }